

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O3

Vec_Int_t * Gia_ManCreateMap(Gia_Man_t *p,Vec_Int_t *vFadds)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = p->nObjs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar3 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  uVar2 = vFadds->nSize;
  if (4 < (long)(int)uVar2) {
    uVar5 = 4;
    uVar6 = 0;
    do {
      if ((ulong)(long)(int)uVar2 <= uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = vFadds->pArray[uVar5];
      if (((long)iVar3 < 0) || (iVar1 <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar3] = (int)uVar6;
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + 5;
    } while ((ulong)uVar2 / 5 != uVar6);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_ManCreateMap( Gia_Man_t * p, Vec_Int_t * vFadds )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );  int i;
    Dtc_ForEachFadd( vFadds, i )
        Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+4), i );
    return vMap;
}